

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

size_t chacha_update(chacha_state *S,uint8_t *in,uint8_t *out,size_t inlen)

{
  size_t __n;
  ulong uVar1;
  ulong in_RCX;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t bytes;
  uint8_t *out_start;
  chacha_state_internal *state;
  size_t in_stack_000003e8;
  uint8_t *in_stack_000003f0;
  uint8_t *in_stack_000003f8;
  chacha_state_internal *in_stack_00000400;
  ulong local_20;
  long local_18;
  void *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (0x3f < *(long *)(in_RDI + 0x38) + in_RCX) {
    if (*(long *)(in_RDI + 0x38) != 0) {
      __n = 0x40 - *(long *)(in_RDI + 0x38);
      if (in_RSI != (void *)0x0) {
        memcpy((void *)(in_RDI + 0x40 + *(long *)(in_RDI + 0x38)),in_RSI,__n);
        local_10 = (void *)(__n + (long)in_RSI);
      }
      chacha_consume(in_stack_00000400,in_stack_000003f8,in_stack_000003f0,in_stack_000003e8);
      local_20 = in_RCX - __n;
      local_18 = in_RDX + 0x40;
      *(undefined8 *)(in_RDI + 0x38) = 0;
    }
    uVar1 = local_20 & 0xffffffffffffffc0;
    if (uVar1 != 0) {
      chacha_consume(in_stack_00000400,in_stack_000003f8,in_stack_000003f0,in_stack_000003e8);
      local_20 = local_20 - uVar1;
      if (local_10 != (void *)0x0) {
        local_10 = (void *)(uVar1 + (long)local_10);
      }
      local_18 = uVar1 + local_18;
    }
  }
  if (local_20 != 0) {
    if (local_10 == (void *)0x0) {
      memset((void *)(in_RDI + 0x40 + *(long *)(in_RDI + 0x38)),0,local_20);
    }
    else {
      memcpy((void *)(in_RDI + 0x40 + *(long *)(in_RDI + 0x38)),local_10,local_20);
    }
    *(ulong *)(in_RDI + 0x38) = local_20 + *(long *)(in_RDI + 0x38);
  }
  return local_18 - in_RDX;
}

Assistant:

size_t
chacha_update(chacha_state *S, const uint8_t *in, uint8_t *out, size_t inlen) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    uint8_t *out_start = out;
    size_t bytes;

    /* enough for at least one block? */
    if ((state->leftover + inlen) >= CHACHA_BLOCKBYTES) {
        /* handle the previous data */
        if (state->leftover) {
            bytes = (CHACHA_BLOCKBYTES - state->leftover);
            if (in) {
                memcpy(state->buffer + state->leftover, in, bytes);
                in += bytes;
            }
            chacha_consume(state, (in) ? state->buffer : NULL, out, CHACHA_BLOCKBYTES);
            inlen -= bytes;
            out += CHACHA_BLOCKBYTES;
            state->leftover = 0;
        }

        /* handle the direct data */
        bytes = (inlen & ~(CHACHA_BLOCKBYTES - 1));
        if (bytes) {
            chacha_consume(state, in, out, bytes);
            inlen -= bytes;
            if (in) in += bytes;
            out += bytes;
        }
    }

    /* handle leftover data */
    if (inlen) {
        if (in) memcpy(state->buffer + state->leftover, in, inlen);
        else memset(state->buffer + state->leftover, 0, inlen);
        state->leftover += inlen;
    }

    return out - out_start;
}